

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeIPCurvature(ChElementShellReissner4 *this)

{
  double dVar1;
  ChMatrix33<double> *pCVar2;
  undefined8 *puVar3;
  double *pdVar4;
  ChVector<double> *pCVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ChVector<double> phi_tilde_2_i;
  ChVector<double> phi_tilde_1_i;
  ChMatrix33<double> mDrot_I;
  ChMatrix33<double> T_overlineGamma_tilde_i;
  ChMatrix33<double> tmp2;
  ChMatrix33<double> mGamma_tilde_i;
  ChMatrix33<double> tmp1;
  ChMatrix33<double> Gamma_I_n_MT_T_overline [4];
  ChVector<double> local_368;
  ChVector<double> local_348;
  ChVector<double> *local_330;
  ChVector<double> *local_328;
  ChVector<double> *local_320;
  ChMatrixNM<double,_4,_2> *local_318;
  ChVector<double> *local_310;
  ChMatrix33<double> *local_308;
  undefined8 *local_300;
  double local_2f8;
  double local_2f0;
  code *local_2e8;
  ChMatrix33<double> *local_2e0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_2d8;
  ChMatrix33<double> local_2d0;
  ChMatrix33<double> local_278;
  ChMatrix33<double> local_230;
  ChMatrix33<double> local_1e8;
  ChMatrix33<double> local_1a0;
  ChMatrix33<double> local_158 [4];
  
  pCVar5 = this->phi_tilde_n;
  lVar8 = 0;
  do {
    rotutils::DRot_I(&local_2d0,pCVar5);
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_2d0;
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&this->T_overline;
    ChMatrix33<double>::operator=
              ((ChMatrix33<double> *)
               ((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + lVar8),
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                *)&local_1e8);
    lVar8 = lVar8 + 0x48;
    pCVar5 = pCVar5 + 1;
  } while (lVar8 != 0x120);
  local_310 = this->phi_tilde_n;
  local_318 = this->L_alpha_beta_i;
  local_320 = this->phi_tilde_i;
  local_328 = this->k_1_i;
  local_330 = this->k_2_i;
  pdVar4 = this->L_alpha_beta_i[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
           m_storage.m_data.array + 1;
  lVar8 = 0;
  local_308 = &this->T_overline;
  do {
    pCVar2 = local_308;
    local_348.m_data[0] = 0.0;
    local_348.m_data[1] = 0.0;
    local_348.m_data[2] = 0.0;
    local_368.m_data[2] = 0.0;
    local_368.m_data[0] = 0.0;
    local_368.m_data[1] = 0.0;
    InterpDeriv(local_310,local_318 + lVar8,&local_348,&local_368);
    pCVar5 = local_320 + lVar8;
    rotutils::DRot(&local_1e8,pCVar5);
    local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)pCVar2;
    local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&local_1e8;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_278,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_2d0);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_348.m_data[2];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_348.m_data[0];
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         local_348.m_data[1] *
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar16 = vfmadd231sd_fma(auVar23,auVar15,auVar20);
    auVar16 = vfmadd231sd_fma(auVar16,auVar17,auVar18);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         local_348.m_data[1] *
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar13 = vfmadd231sd_fma(auVar24,auVar12,auVar20);
    auVar13 = vfmadd231sd_fma(auVar13,auVar14,auVar18);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         local_348.m_data[1] *
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar10 = vfmadd231sd_fma(auVar22,auVar9,auVar20);
    auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar18);
    local_328[lVar8].m_data[0] = auVar10._0_8_;
    local_328[lVar8].m_data[1] = auVar13._0_8_;
    local_328[lVar8].m_data[2] = auVar16._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_368.m_data[2];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_368.m_data[0];
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_368.m_data[1] *
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar16 = vfmadd231sd_fma(auVar16,auVar21,auVar15);
    auVar16 = vfmadd231sd_fma(auVar16,auVar19,auVar17);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         local_368.m_data[1] *
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar12);
    auVar13 = vfmadd231sd_fma(auVar13,auVar19,auVar14);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_368.m_data[1] *
         local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar10 = vfmadd231sd_fma(auVar10,auVar9,auVar21);
    auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar19);
    local_330[lVar8].m_data[0] = auVar10._0_8_;
    local_330[lVar8].m_data[1] = auVar13._0_8_;
    local_330[lVar8].m_data[2] = auVar16._0_8_;
    rotutils::Elle(&local_2d0,pCVar5,&local_348);
    local_230.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)pCVar2;
    local_230.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&local_2d0;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_1a0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_230);
    rotutils::Elle(&local_2d0,pCVar5,&local_368);
    local_2e0 = pCVar2;
    local_2d8 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)&local_2d0;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_230,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_2e0);
    local_300 = &xi_i + lVar8 * 2;
    lVar6 = 0;
    lVar7 = 0;
    do {
      puVar3 = local_300;
      dVar1 = (double)((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + lVar6);
      local_2e8 = *(code **)((long)&LI + lVar7);
      local_2f0 = dVar1;
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)(*local_2e8)(local_300);
      local_2f8 = (double)((long)this->Phi_Delta_i[0][0].super_Matrix<double,_3,_3,_1,_3,_3>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + lVar6);
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           *(double *)((long)pdVar4 + lVar7 * 2 + -8);
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)&local_1a0;
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar1
      ;
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_2f8;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 ((long)this->Kappa_delta_i_1[0][0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar6),
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
                  *)&local_2d0);
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)(*local_2e8)(puVar3);
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           *(double *)((long)pdVar4 + lVar7 * 2);
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)&local_230;
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_2f0;
      local_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_2f8;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 ((long)this->Kappa_delta_i_2[0][0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar6),
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
                  *)&local_2d0);
      lVar7 = lVar7 + 8;
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0x120);
    lVar8 = lVar8 + 1;
    this = (ChElementShellReissner4 *)
           ((this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
            m_storage.m_data.array + 0xc);
    pdVar4 = pdVar4 + 8;
  } while (lVar8 != 4);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeIPCurvature() {
    ChMatrix33<> Gamma_I_n_MT_T_overline[NUMNODES];
    for (int n = 0; n < NUMNODES; n++) {
        ChMatrix33<> mDrot_I = rotutils::DRot_I(phi_tilde_n[n]);
#ifdef CHSIMPLIFY_DROT
        mDrot_I = ChMatrix33<>(1);
#endif
        Gamma_I_n_MT_T_overline[n] = mDrot_I * T_overline.transpose();
    }
    for (int i = 0; i < NUMIP; i++) {
        ChVector<> phi_tilde_1_i;
        ChVector<> phi_tilde_2_i;
        InterpDeriv(phi_tilde_n, L_alpha_beta_i[i], phi_tilde_1_i, phi_tilde_2_i);
        ChMatrix33<> mGamma_tilde_i = rotutils::DRot(phi_tilde_i[i]);
#ifdef CHSIMPLIFY_DROT
        mGamma_tilde_i = ChMatrix33<>(1);
#endif
        ChMatrix33<> T_overlineGamma_tilde_i(T_overline * mGamma_tilde_i);
        k_1_i[i] = T_overlineGamma_tilde_i * phi_tilde_1_i;
        k_2_i[i] = T_overlineGamma_tilde_i * phi_tilde_2_i;
        ChMatrix33<> tmp1 = T_overline * rotutils::Elle(phi_tilde_i[i], phi_tilde_1_i);
        ChMatrix33<> tmp2 = T_overline * rotutils::Elle(phi_tilde_i[i], phi_tilde_2_i);
#ifdef CHSIMPLIFY_DROT
        tmp1 = T_overline;
        tmp2 = T_overline;
#endif
        for (int n = 0; n < NUMNODES; n++) {
            Kappa_delta_i_1[i][n] =
                tmp1 * Gamma_I_n_MT_T_overline[n] * LI[n](xi_i[i]) + Phi_Delta_i[i][n] * L_alpha_beta_i[i](n, 0);
            Kappa_delta_i_2[i][n] =
                tmp2 * Gamma_I_n_MT_T_overline[n] * LI[n](xi_i[i]) + Phi_Delta_i[i][n] * L_alpha_beta_i[i](n, 1);
        }
    }
}